

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

bool __thiscall ON_Mesh::Compact(ON_Mesh *this)

{
  int iVar1;
  ON_TextureCoordinates *pOVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  
  iVar1 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  if ((this->m_FN).super_ON_SimpleArray<ON_3fVector>.m_count != (this->m_F).m_count) {
    ON_SimpleArray<ON_3fVector>::SetCapacity(&(this->m_FN).super_ON_SimpleArray<ON_3fVector>,0);
  }
  if ((this->m_N).super_ON_SimpleArray<ON_3fVector>.m_count != iVar1) {
    ON_SimpleArray<ON_3fVector>::SetCapacity(&(this->m_N).super_ON_SimpleArray<ON_3fVector>,0);
  }
  if ((this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count != iVar1) {
    ON_SimpleArray<ON_2fPoint>::SetCapacity(&(this->m_T).super_ON_SimpleArray<ON_2fPoint>,0);
  }
  uVar5 = (ulong)(this->m_TC).m_count;
  if (0 < (long)uVar5) {
    lVar4 = uVar5 * 0xb8 + -8;
    do {
      if (*(int *)((((this->m_TC).m_a)->m_tag).m_mapping_id.Data4 + lVar4 + -8) != iVar1) {
        ON_ClassArray<ON_TextureCoordinates>::Remove(&this->m_TC,(int)uVar5 + -1);
      }
      lVar4 = lVar4 + -0xb8;
      bVar3 = 1 < uVar5;
      uVar5 = uVar5 - 1;
    } while (bVar3);
  }
  if ((this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count != iVar1) {
    ON_SimpleArray<ON_2dPoint>::SetCapacity(&(this->m_S).super_ON_SimpleArray<ON_2dPoint>,0);
  }
  if ((this->m_K).m_count != iVar1) {
    ON_SimpleArray<ON_SurfaceCurvature>::SetCapacity(&this->m_K,0);
  }
  if ((this->m_C).m_count != iVar1) {
    ON_SimpleArray<ON_Color>::SetCapacity(&this->m_C,0);
  }
  if ((this->m_H).m_count != iVar1) {
    ON_SimpleArray<bool>::SetCapacity(&this->m_H,0);
  }
  CullUnusedVertices(this);
  ON_SimpleArray<ON_3fPoint>::SetCapacity
            (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,
             (long)(this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count);
  ON_SimpleArray<ON_MeshFace>::SetCapacity(&this->m_F,(long)(this->m_F).m_count);
  ON_SimpleArray<ON_3fVector>::SetCapacity
            (&(this->m_N).super_ON_SimpleArray<ON_3fVector>,
             (long)(this->m_N).super_ON_SimpleArray<ON_3fVector>.m_count);
  ON_SimpleArray<ON_3fVector>::SetCapacity
            (&(this->m_FN).super_ON_SimpleArray<ON_3fVector>,
             (long)(this->m_FN).super_ON_SimpleArray<ON_3fVector>.m_count);
  ON_SimpleArray<ON_SurfaceCurvature>::SetCapacity(&this->m_K,(long)(this->m_K).m_count);
  ON_SimpleArray<ON_Color>::SetCapacity(&this->m_C,(long)(this->m_C).m_count);
  ON_SimpleArray<ON_2dPoint>::SetCapacity
            (&(this->m_S).super_ON_SimpleArray<ON_2dPoint>,
             (long)(this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count);
  ON_SimpleArray<ON_2fPoint>::SetCapacity
            (&(this->m_T).super_ON_SimpleArray<ON_2fPoint>,
             (long)(this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count);
  if (0 < (this->m_TC).m_count) {
    lVar4 = 0xa0;
    lVar6 = 0;
    do {
      pOVar2 = (this->m_TC).m_a;
      ON_SimpleArray<ON_3fPoint>::SetCapacity
                ((ON_SimpleArray<ON_3fPoint> *)((pOVar2->m_tag).m_mapping_id.Data4 + lVar4 + -8),
                 (long)*(int *)((long)((pOVar2->m_tag).m_mesh_xform.m_xform + -1) + 0x18 + lVar4));
      lVar6 = lVar6 + 1;
      lVar4 = lVar4 + 0xb8;
    } while (lVar6 < (this->m_TC).m_count);
  }
  return true;
}

Assistant:

bool ON_Mesh::Compact()
{
  unsigned int meshVcount = m_V.UnsignedCount();
  unsigned int meshFcount = m_F.UnsignedCount();

  if (m_FN.UnsignedCount() != meshFcount)
    m_FN.Destroy();

  if (m_N.UnsignedCount() != meshVcount)
    m_N.Destroy();

  if (m_T.UnsignedCount() != meshVcount)
    m_T.Destroy();

  for (int i = m_TC.Count() - 1; i >= 0; i--)
  {
    if (m_TC[i].m_T.UnsignedCount() != meshVcount)
      m_TC.Remove(i);
  }

  if (m_S.UnsignedCount() != meshVcount)
    m_S.Destroy();

  if (m_K.UnsignedCount() != meshVcount)
    m_K.Destroy();

  if (m_C.UnsignedCount() != meshVcount)
    m_C.Destroy();

  if (m_H.UnsignedCount() != meshVcount)
    m_H.Destroy();

  CullUnusedVertices();

  m_V.Shrink();
  m_F.Shrink();
  m_N.Shrink();
  m_FN.Shrink();
  m_K.Shrink();
  m_C.Shrink();
  m_S.Shrink();
  m_T.Shrink();

  for (int i = 0; i < m_TC.Count(); i++)
    m_TC[i].m_T.Shrink();

  return true;
}